

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs_no_zeroinit.h
# Opt level: O1

void __thiscall BMRS_XZ<RemSP>::SecondScan(BMRS_XZ<RemSP> *this)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  Mat1b *pMVar6;
  Mat1i *pMVar7;
  uint64_t *puVar8;
  long lVar9;
  uint *puVar10;
  Run *pRVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  Run *pRVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long local_a0;
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pRVar17 = (this->data_runs).runs;
  uVar23 = *(uint *)&pMVar6->field_0x8;
  iVar4 = *(int *)&pMVar6->field_0xc;
  if (1 < (int)uVar23) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    puVar8 = (this->data_compressed).bits;
    lVar15 = *(long *)&pMVar7->field_0x10;
    lVar9 = **(long **)&pMVar7->field_0x48;
    uVar13 = 0;
    local_a0 = lVar15;
    do {
      puVar10 = RemSP::P_;
      lVar14 = lVar9 * 2 * uVar13;
      iVar5 = (this->data_compressed).data_width;
      iVar12 = (int)uVar13 * iVar5;
      uVar22 = 0;
      pRVar11 = pRVar17;
      do {
        pRVar17 = pRVar11;
        uVar2 = pRVar17->start_pos;
        if (uVar2 == 0xffff) {
          if ((int)uVar22 < iVar4) {
            memset((void *)(lVar14 + lVar15 + (long)(int)uVar22 * 4),0,
                   (ulong)(iVar4 + ~uVar22) * 4 + 4);
            memset((void *)(lVar9 + lVar15 + lVar14 + (long)(int)uVar22 * 4),0,
                   (ulong)(~uVar22 + iVar4) * 4 + 4);
          }
          pRVar17 = pRVar17 + 1;
        }
        else {
          uVar3 = pRVar17->end_pos;
          uVar16 = puVar10[pRVar17->label];
          if ((int)uVar22 < (int)(uint)uVar2) {
            lVar1 = local_a0 + (long)(int)uVar22 * 4;
            lVar18 = 0;
            do {
              *(undefined4 *)(lVar1 + lVar18 * 4) = 0;
              *(undefined4 *)(lVar9 + lVar1 + lVar18 * 4) = 0;
              lVar18 = lVar18 + 1;
            } while ((ulong)uVar2 - (long)(int)uVar22 != lVar18);
            uVar22 = uVar22 + (int)lVar18;
          }
          if ((int)uVar22 < (int)(uint)uVar3) {
            lVar1 = local_a0 + (long)(int)uVar22 * 4;
            lVar18 = 0;
            do {
              lVar20 = (long)((int)(uVar22 + (int)lVar18) >> 6);
              uVar19 = uVar22 + (int)lVar18 & 0x3f;
              uVar21 = uVar16;
              if ((puVar8[iVar12 * 2 + lVar20] >> uVar19 & 1) == 0) {
                uVar21 = 0;
              }
              *(uint *)(lVar1 + lVar18 * 4) = uVar21;
              uVar21 = uVar16;
              if ((puVar8[(long)(iVar12 * 2) + iVar5 + lVar20] >> uVar19 & 1) == 0) {
                uVar21 = 0;
              }
              *(uint *)(lVar9 + lVar1 + lVar18 * 4) = uVar21;
              lVar18 = lVar18 + 1;
            } while (((long)(int)uVar22 - (ulong)uVar3) + lVar18 != 0);
            uVar22 = uVar22 + (int)lVar18;
          }
        }
        pRVar11 = pRVar17 + 1;
      } while (uVar2 != 0xffff);
      uVar13 = uVar13 + 1;
      local_a0 = local_a0 + lVar9 * 2;
    } while (uVar13 != uVar23 >> 1);
  }
  puVar10 = RemSP::P_;
  if ((uVar23 & 1) != 0) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar15 = (long)(int)(uVar23 - 1) * **(long **)&pMVar7->field_0x48 + *(long *)&pMVar7->field_0x10
    ;
    uVar13 = 0;
    do {
      uVar2 = pRVar17->start_pos;
      uVar23 = (uint)uVar13;
      if (uVar2 == 0xffff) {
        if ((int)uVar23 < iVar4) {
          memset((void *)(lVar15 + (long)(int)uVar23 * 4),0,(ulong)(~uVar23 + iVar4) * 4 + 4);
        }
      }
      else {
        uVar3 = pRVar17->end_pos;
        uVar22 = puVar10[pRVar17->label];
        uVar16 = (uint)uVar2;
        if ((int)uVar23 < (int)uVar16) {
          memset((void *)(lVar15 + (long)(int)uVar23 * 4),0,(ulong)(~uVar23 + uVar16) * 4 + 4);
        }
        uVar13 = (ulong)uVar16;
        if (uVar2 < uVar3) {
          uVar13 = (ulong)uVar16;
          do {
            *(uint *)(lVar15 + uVar13 * 4) = uVar22;
            uVar13 = uVar13 + 1;
          } while (uVar3 != uVar13);
        }
      }
      pRVar17 = pRVar17 + 1;
    } while (uVar2 != 0xffff);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels_u[k] = 0;
                    for (int k = j; k < w; k++) labels_d[k] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (; j < start_pos; j++) labels_u[j] = 0, labels_d[j] = 0;
                for (; j < end_pos; j++) {
                    labels_u[j] = (data_u[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                    labels_d[j] = (data_d[j >> 6] & (1ull << (j & 0x3F))) ? label : 0;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (int k = j; k < w; k++) labels[k] = 0;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }